

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O1

int LZ4_decompress_safe(char *source,char *dest,int compressedSize,int maxDecompressedSize)

{
  ushort *puVar1;
  byte *pbVar2;
  byte bVar3;
  undefined8 uVar4;
  ushort uVar5;
  ushort uVar6;
  BYTE *s_1;
  ushort *puVar7;
  long lVar8;
  uint uVar9;
  char cVar10;
  ushort *puVar11;
  uint uVar12;
  BYTE *d;
  byte *pbVar13;
  byte *pbVar14;
  byte *pbVar15;
  byte *pbVar16;
  ushort *puVar17;
  ulong uVar18;
  byte *pbVar19;
  BYTE *d_1;
  byte *pbVar20;
  int iVar21;
  ulong uVar22;
  ulong uStack_70;
  int local_60;
  
  puVar7 = (ushort *)0xffffffffffffffff;
  if (source != (char *)0x0) {
    if (maxDecompressedSize == 0) {
      if (compressedSize == 1) {
        puVar7 = (ushort *)(ulong)-(uint)(*source != '\0');
      }
    }
    else if (compressedSize != 0) {
      puVar1 = (ushort *)(source + compressedSize);
      pbVar2 = (byte *)(dest + maxDecompressedSize);
      puVar7 = (ushort *)source;
      pbVar13 = (byte *)dest;
      if (maxDecompressedSize < 0x40) goto LAB_00103b0c;
      puVar11 = (ushort *)((long)puVar1 - 0xf);
      puVar17 = (ushort *)source;
      pbVar15 = (byte *)source;
LAB_001035c0:
      pbVar14 = pbVar13;
      bVar3 = (byte)*puVar17;
      uVar9 = (uint)bVar3;
      puVar7 = (ushort *)((long)puVar17 + 1);
      uVar22 = (ulong)(uint)(bVar3 >> 4);
      if (bVar3 >> 4 == 0xf) {
        uVar22 = 0xf;
        puVar17 = puVar7;
        if (puVar7 < puVar11) {
          uVar12 = 0;
          do {
            uVar5 = *puVar17;
            puVar17 = (ushort *)((long)puVar17 + 1);
            uVar12 = uVar12 + (byte)uVar5;
          } while (puVar17 < puVar11 && (byte)uVar5 == 0xff);
          uVar22 = (ulong)uVar12 + 0xf;
        }
        pbVar13 = pbVar14 + uVar22;
        if (((puVar11 <= puVar7) || (CARRY8((ulong)pbVar14,uVar22))) ||
           (CARRY8((ulong)puVar17,uVar22))) {
          iVar21 = 5;
          puVar7 = puVar17;
        }
        else {
          pbVar15 = pbVar13;
          if ((pbVar2 + -0x20 < pbVar13) || (puVar1 + -0x10 < (ushort *)((long)puVar17 + uVar22))) {
            iVar21 = 6;
            puVar7 = puVar17;
          }
          else {
            lVar8 = 0;
            do {
              uVar4 = *(undefined8 *)((byte *)((long)puVar17 + lVar8) + 8);
              pbVar19 = pbVar14 + lVar8;
              *(undefined8 *)pbVar19 = *(undefined8 *)((long)puVar17 + lVar8);
              *(undefined8 *)(pbVar19 + 8) = uVar4;
              pbVar16 = (byte *)((long)puVar17 + lVar8 + 0x10);
              uVar4 = *(undefined8 *)(pbVar16 + 8);
              *(undefined8 *)(pbVar19 + 0x10) = *(undefined8 *)pbVar16;
              *(undefined8 *)(pbVar19 + 0x18) = uVar4;
              lVar8 = lVar8 + 0x20;
            } while (pbVar19 + 0x20 < pbVar13);
            iVar21 = 0;
            puVar7 = (ushort *)((long)puVar17 + uVar22);
            pbVar14 = pbVar13;
          }
        }
        if (iVar21 != 0) {
          if (iVar21 != 5) {
            if (iVar21 == 6) goto LAB_00103a1b;
            goto LAB_00103909;
          }
          goto LAB_00103bd0;
        }
      }
      else {
        pbVar15 = pbVar14 + uVar22;
        if ((ushort *)((long)puVar1 - 0x11U) < puVar7) goto LAB_00103a1b;
        uVar4 = *(undefined8 *)((long)puVar17 + 9);
        *(undefined8 *)pbVar14 = *(undefined8 *)puVar7;
        *(undefined8 *)(pbVar14 + 8) = uVar4;
        puVar7 = (ushort *)(uVar22 + (long)puVar7);
        pbVar14 = pbVar15;
      }
      uVar5 = *puVar7;
      uVar18 = (ulong)uVar5;
      puVar7 = puVar7 + 1;
      pbVar19 = pbVar14 + -uVar18;
      uVar22 = (ulong)(bVar3 & 0xf);
      if (uVar22 == 0xf) {
        if (pbVar19 < dest) {
          iVar21 = 5;
          uStack_70 = 0xf;
        }
        else {
          uVar9 = 0;
          do {
            uVar6 = *puVar7;
            puVar7 = (ushort *)((long)puVar7 + 1);
            uVar9 = uVar9 + (byte)uVar6;
          } while ((byte)uVar6 == 0xff && puVar7 < puVar1 + -2);
          uVar22 = (ulong)uVar9;
          uStack_70 = uVar22 + 0xf;
          if ((puVar1 + -2 <= puVar7) || (CARRY8((ulong)pbVar14,uStack_70))) {
            iVar21 = 5;
          }
          else {
            uStack_70 = uVar22 + 0x13;
            iVar21 = 7;
            if (pbVar14 + uVar22 + 0x13 < pbVar2 + -0x40) {
              iVar21 = 0;
            }
          }
        }
        if (iVar21 != 0) {
          if (iVar21 != 5) {
            if (iVar21 != 7) goto LAB_00103909;
            goto LAB_00103aac;
          }
          goto LAB_00103bd0;
        }
      }
      else {
        uStack_70 = uVar22 + 4;
        if (pbVar2 + -0x40 <= pbVar14 + uVar22 + 4) goto LAB_00103aac;
        if ((dest <= pbVar19) && (7 < uVar5)) {
          *(undefined8 *)pbVar14 = *(undefined8 *)pbVar19;
          *(undefined8 *)(pbVar14 + 8) = *(undefined8 *)(pbVar19 + 8);
          *(undefined2 *)(pbVar14 + 0x10) = *(undefined2 *)(pbVar19 + 0x10);
          puVar17 = puVar7;
          pbVar13 = pbVar14 + uVar22 + 4;
          goto LAB_001035c0;
        }
      }
      if (pbVar19 < dest) goto LAB_00103bd0;
      pbVar15 = pbVar14 + uStack_70;
      puVar17 = puVar7;
      pbVar13 = pbVar15;
      if (uVar5 < 0x10) {
        if (uVar18 == 4) {
          iVar21 = *(int *)pbVar19;
LAB_001037ff:
          *(int *)pbVar14 = iVar21;
          *(int *)(pbVar14 + 4) = iVar21;
          if (8 < uStack_70) {
            pbVar14 = pbVar14 + 8;
            do {
              *(int *)pbVar14 = iVar21;
              *(int *)(pbVar14 + 4) = iVar21;
              pbVar14 = pbVar14 + 8;
            } while (pbVar14 < pbVar15);
          }
        }
        else {
          if (uVar5 == 2) {
            iVar21 = CONCAT22(*(undefined2 *)pbVar19,*(undefined2 *)pbVar19);
            goto LAB_001037ff;
          }
          if (uVar5 == 1) {
            iVar21 = (uint)*pbVar19 * 0x1010101;
            goto LAB_001037ff;
          }
          if (uVar5 < 8) {
            pbVar14[0] = 0;
            pbVar14[1] = 0;
            pbVar14[2] = 0;
            pbVar14[3] = 0;
            *pbVar14 = *pbVar19;
            pbVar14[1] = pbVar19[1];
            pbVar14[2] = pbVar19[2];
            pbVar14[3] = pbVar19[3];
            uVar9 = inc32table[uVar5];
            *(undefined4 *)(pbVar14 + 4) = *(undefined4 *)(pbVar19 + uVar9);
            pbVar19 = pbVar19 + ((ulong)uVar9 - (long)dec64table[uVar5]);
          }
          else {
            *(undefined8 *)pbVar14 = *(undefined8 *)pbVar19;
            pbVar19 = pbVar19 + 8;
          }
          pbVar14 = pbVar14 + 8;
          do {
            *(undefined8 *)pbVar14 = *(undefined8 *)pbVar19;
            pbVar14 = pbVar14 + 8;
            pbVar19 = pbVar19 + 8;
          } while (pbVar14 < pbVar15);
        }
      }
      else {
        do {
          uVar4 = *(undefined8 *)(pbVar14 + -uVar18 + 8);
          *(undefined8 *)pbVar14 = *(undefined8 *)(pbVar14 + -uVar18);
          *(undefined8 *)(pbVar14 + 8) = uVar4;
          uVar4 = *(undefined8 *)(pbVar14 + -uVar18 + 0x10 + 8);
          *(undefined8 *)(pbVar14 + 0x10) = *(undefined8 *)(pbVar14 + -uVar18 + 0x10);
          *(undefined8 *)(pbVar14 + 0x18) = uVar4;
          pbVar14 = pbVar14 + 0x20;
        } while (pbVar14 < pbVar15);
      }
      goto LAB_001035c0;
    }
  }
LAB_00103909:
  return (int)puVar7;
LAB_00103aac:
  if (pbVar19 < dest) goto LAB_00103bd0;
  pbVar13 = pbVar14 + uStack_70;
  if ((uint)uVar18 < 8) {
    pbVar14[0] = 0;
    pbVar14[1] = 0;
    pbVar14[2] = 0;
    pbVar14[3] = 0;
    *pbVar14 = *pbVar19;
    pbVar14[1] = pbVar19[1];
    pbVar14[2] = pbVar19[2];
    pbVar14[3] = pbVar19[3];
    uVar18 = (ulong)((uint)uVar18 << 2);
    uVar22 = (ulong)*(uint *)((long)inc32table + uVar18);
    *(undefined4 *)(pbVar14 + 4) = *(undefined4 *)(pbVar19 + uVar22);
    pbVar19 = pbVar19 + (uVar22 - (long)*(int *)((long)dec64table + uVar18));
  }
  else {
    *(undefined8 *)pbVar14 = *(undefined8 *)pbVar19;
    pbVar19 = pbVar19 + 8;
  }
  pbVar15 = pbVar14 + 8;
  if (pbVar2 + -0xc < pbVar13) {
    iVar21 = 5;
    if (pbVar13 <= pbVar2 + -5) {
      pbVar14 = pbVar2 + -7;
      pbVar16 = pbVar19;
      pbVar20 = pbVar15;
      if (pbVar15 < pbVar14) {
        do {
          *(undefined8 *)pbVar20 = *(undefined8 *)pbVar16;
          pbVar20 = pbVar20 + 8;
          pbVar16 = pbVar16 + 8;
        } while (pbVar20 < pbVar14);
        pbVar19 = pbVar19 + ((long)pbVar14 - (long)pbVar15);
        pbVar15 = pbVar14;
      }
      iVar21 = 0;
      for (; pbVar15 < pbVar13; pbVar15 = pbVar15 + 1) {
        bVar3 = *pbVar19;
        pbVar19 = pbVar19 + 1;
        *pbVar15 = bVar3;
      }
    }
    if (iVar21 != 0) {
      if (iVar21 != 5) goto LAB_00103909;
      goto LAB_00103bd0;
    }
  }
  else {
    *(undefined8 *)pbVar15 = *(undefined8 *)pbVar19;
    if (0x10 < uStack_70) {
      pbVar14 = pbVar14 + 0x10;
      do {
        pbVar19 = pbVar19 + 8;
        *(undefined8 *)pbVar14 = *(undefined8 *)pbVar19;
        pbVar14 = pbVar14 + 8;
      } while (pbVar14 < pbVar13);
    }
  }
LAB_00103b0c:
  bVar3 = (byte)*puVar7;
  puVar11 = (ushort *)((long)puVar7 + 1);
  while( true ) {
    uVar9 = (uint)bVar3;
    puVar7 = puVar11;
    if (bVar3 >> 4 == 0xf) break;
    uVar22 = (ulong)(uint)(bVar3 >> 4);
    if ((source + (long)compressedSize + -0x10 <= puVar11) ||
       (dest + (long)maxDecompressedSize + -0x20 < pbVar13)) goto LAB_00103a15;
    uVar4 = *(undefined8 *)(puVar11 + 4);
    *(undefined8 *)pbVar13 = *(undefined8 *)puVar11;
    *(undefined8 *)(pbVar13 + 8) = uVar4;
    pbVar15 = pbVar13 + uVar22;
    uStack_70 = (ulong)(uVar9 & 0xf);
    puVar7 = (ushort *)((long)puVar11 + uVar22) + 1;
    uVar5 = *(ushort *)((long)puVar11 + uVar22);
    uVar18 = (ulong)uVar5;
    pbVar19 = pbVar15 + -uVar18;
    if ((((uVar9 & 0xf) == 0xf) || (uVar5 < 8)) || (pbVar19 < dest)) goto LAB_00103a60;
    *(undefined8 *)pbVar15 = *(undefined8 *)pbVar19;
    *(undefined8 *)(pbVar15 + 8) = *(undefined8 *)(pbVar19 + 8);
    *(undefined2 *)(pbVar15 + 0x10) = *(undefined2 *)(pbVar19 + 0x10);
    pbVar13 = pbVar15 + uStack_70 + 4;
    bVar3 = *(byte *)((long)puVar11 + uVar22 + 2);
    puVar11 = (ushort *)((long)puVar11 + uVar22 + 3);
  }
  puVar17 = (ushort *)((long)puVar1 - 0xf);
  uVar22 = 0xf;
  if (puVar11 < puVar17) {
    uVar12 = 0;
    do {
      uVar5 = *puVar7;
      puVar7 = (ushort *)((long)puVar7 + 1);
      uVar12 = uVar12 + (byte)uVar5;
    } while (puVar7 < puVar17 && (byte)uVar5 == 0xff);
    uVar22 = (ulong)uVar12 + 0xf;
  }
  if (((puVar17 <= puVar11) || (CARRY8((ulong)pbVar13,uVar22))) || (CARRY8((ulong)puVar7,uVar22)))
  goto LAB_00103bd0;
LAB_00103a15:
  pbVar15 = pbVar13 + uVar22;
  pbVar14 = pbVar13;
LAB_00103a1b:
  puVar11 = (ushort *)((long)puVar7 + uVar22);
  if ((pbVar2 + -0xc < pbVar15) || (puVar1 + -4 < puVar11)) {
    if ((puVar11 == puVar1) && (pbVar15 <= pbVar2)) {
      memmove(pbVar14,puVar7,uVar22);
      puVar7 = (ushort *)(ulong)(uint)(((int)pbVar14 + (int)uVar22) - (int)dest);
      goto LAB_00103909;
    }
    goto LAB_00103bd0;
  }
  do {
    *(undefined8 *)pbVar14 = *(undefined8 *)puVar7;
    pbVar14 = pbVar14 + 8;
    puVar7 = puVar7 + 4;
  } while (pbVar14 < pbVar15);
  uVar18 = (ulong)*puVar11;
  puVar7 = puVar11 + 1;
  pbVar19 = pbVar15 + -uVar18;
  uStack_70 = (ulong)(uVar9 & 0xf);
LAB_00103a60:
  if ((int)uStack_70 == 0xf) {
    uVar9 = 0;
    do {
      uVar5 = *puVar7;
      puVar7 = (ushort *)((long)puVar7 + 1);
      uVar9 = uVar9 + (byte)uVar5;
    } while (puVar7 < puVar1 + -2 && (byte)uVar5 == 0xff);
    uStack_70 = (ulong)uVar9 + 0xf;
    cVar10 = '\x05';
    if (puVar7 < puVar1 + -2) {
      cVar10 = CARRY8((ulong)pbVar15,uStack_70) * '\x05';
    }
    if (cVar10 != '\0') {
      if (cVar10 != '\x05') goto LAB_00103909;
      goto LAB_00103bd0;
    }
  }
  uStack_70 = uStack_70 + 4;
  pbVar14 = pbVar15;
  goto LAB_00103aac;
LAB_00103bd0:
  local_60 = (int)source;
  puVar7 = (ushort *)(ulong)(~(uint)puVar7 + local_60);
  goto LAB_00103909;
}

Assistant:

LZ4_FORCE_O2
int LZ4_decompress_safe(const char* source, char* dest, int compressedSize, int maxDecompressedSize)
{
    return LZ4_decompress_generic(source, dest, compressedSize, maxDecompressedSize,
                                  endOnInputSize, decode_full_block, noDict,
                                  (BYTE*)dest, NULL, 0);
}